

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_rotate_z(vec4 *m,float rad,vec4 *dest)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar4;
  __m128 a;
  __m128 a_00;
  __m128 a_01;
  __m128 a_02;
  __m128 a_03;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 b_02;
  __m128 b_03;
  __m128 b_04;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  __m128 c_05;
  float s;
  float c;
  mat4 t;
  __m128 v2;
  __m128 v1;
  __m128 v0;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 l;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  float local_2ec;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  ulong local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  ulong *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_308 = 0;
  local_318 = 0;
  uStack_320 = 0;
  uStack_330 = 0;
  uStack_310 = 0x3f800000;
  uStack_300 = 0x3f80000000000000;
  local_2f8 = in_RSI;
  local_2ec = in_XMM0_Da;
  local_2e8 = in_RDI;
  fVar3 = cosf(in_XMM0_Da);
  afVar4[0] = sinf(local_2ec);
  local_338 = CONCAT44(afVar4[0],fVar3);
  local_328 = CONCAT44(fVar3,afVar4[0]) ^ 0x80000000;
  local_2d0 = local_2e8;
  local_2d8 = &local_338;
  local_2e0 = local_2f8;
  local_240 = local_2e8;
  local_250 = local_2f8;
  local_190 = local_2e8;
  local_188 = *local_2e8;
  uStack_180 = local_2e8[1];
  local_278 = local_338;
  uStack_270 = uStack_330;
  local_1a0 = &local_328;
  local_288 = local_328;
  uStack_280 = uStack_320;
  local_1a8 = &local_318;
  local_298 = local_318;
  uStack_290 = uStack_310;
  local_138 = CONCAT44(fVar3,fVar3);
  uStack_130 = CONCAT44(fVar3,fVar3);
  local_148._0_4_ = (float)local_188;
  local_148._4_4_ = (float)((ulong)local_188 >> 0x20);
  uStack_140._0_4_ = (float)uStack_180;
  uStack_140._4_4_ = (float)((ulong)uStack_180 >> 0x20);
  local_2a8 = CONCAT44(fVar3 * local_148._4_4_,fVar3 * (float)local_148);
  uStack_2a0 = CONCAT44(fVar3 * uStack_140._4_4_,fVar3 * (float)uStack_140);
  local_28._0_4_ = (float)local_328;
  local_b8 = (float)local_28;
  fStack_b4 = (float)local_28;
  fStack_b0 = (float)local_28;
  fStack_ac = (float)local_28;
  local_158 = CONCAT44((float)local_28,(float)local_28);
  uStack_150 = CONCAT44((float)local_28,(float)local_28);
  local_2b8 = CONCAT44((float)local_28 * local_148._4_4_,(float)local_28 * (float)local_148);
  uStack_2b0 = CONCAT44((float)local_28 * uStack_140._4_4_,(float)local_28 * (float)uStack_140);
  local_38._0_4_ = (float)local_318;
  local_c8 = (float)local_38;
  fStack_c4 = (float)local_38;
  fStack_c0 = (float)local_38;
  fStack_bc = (float)local_38;
  local_178 = CONCAT44((float)local_38,(float)local_38);
  uStack_170 = CONCAT44((float)local_38,(float)local_38);
  local_2c8 = CONCAT44((float)local_38 * local_148._4_4_,(float)local_38 * (float)local_148);
  _fStack_2c0 = CONCAT44((float)local_38 * uStack_140._4_4_,(float)local_38 * (float)uStack_140);
  local_1b0 = local_2e8 + 2;
  local_268 = *local_1b0;
  uStack_260 = local_2e8[3];
  afVar4[1] = afVar4[0];
  afVar4[2] = (float)(int)local_268;
  afVar4[3] = (float)(int)((ulong)local_268 >> 0x20);
  b[2] = (float)(int)in_XMM3_Qa;
  b[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b[0] = fVar3 * (float)local_148;
  b[1] = fVar3 * local_148._4_4_;
  c_00[2] = (float)(int)in_XMM5_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_00[0] = (float)(int)in_XMM4_Qa;
  c_00[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_248 = local_2d8;
  local_198 = local_2d8;
  local_168 = local_188;
  uStack_160 = uStack_180;
  local_148 = local_188;
  uStack_140 = uStack_180;
  local_d8 = afVar4[0];
  fStack_d4 = afVar4[0];
  fStack_d0 = afVar4[0];
  fStack_cc = afVar4[0];
  local_a8 = fVar3;
  fStack_a4 = fVar3;
  fStack_a0 = fVar3;
  fStack_9c = fVar3;
  local_48 = local_278;
  uStack_40 = uStack_270;
  local_38 = local_298;
  uStack_30 = uStack_290;
  local_28 = local_288;
  uStack_20 = uStack_280;
  local_18 = local_278;
  uStack_10 = uStack_270;
  afVar4 = glmm_fmadd(afVar4,b,c_00);
  local_2a8 = afVar4._0_8_;
  local_58 = local_288;
  uVar2 = local_58;
  uStack_50 = uStack_280;
  local_58._4_4_ = (undefined4)(local_288 >> 0x20);
  local_e8 = local_58._4_4_;
  uStack_e4 = local_58._4_4_;
  uStack_e0 = local_58._4_4_;
  uStack_dc = local_58._4_4_;
  a[1] = (float)local_58._4_4_;
  a[0] = (float)local_58._4_4_;
  a[2] = (float)(undefined4)local_268;
  a[3] = (float)local_268._4_4_;
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_00[0] = (float)(undefined4)local_2b8;
  b_00[1] = (float)local_2b8._4_4_;
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_58 = uVar2;
  afVar4 = glmm_fmadd(a,b_00,c_01);
  local_2b8 = afVar4._0_8_;
  local_68 = local_298;
  uVar1 = local_68;
  uStack_60 = uStack_290;
  local_68._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
  local_f8 = local_68._4_4_;
  uStack_f4 = local_68._4_4_;
  uStack_f0 = local_68._4_4_;
  uStack_ec = local_68._4_4_;
  a_00[1] = (float)local_68._4_4_;
  a_00[0] = (float)local_68._4_4_;
  a_00[2] = (float)(undefined4)local_268;
  a_00[3] = (float)local_268._4_4_;
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_01[0] = (float)(undefined4)local_2c8;
  b_01[1] = (float)local_2c8._4_4_;
  c_02[2] = (float)(int)in_XMM5_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_02[0] = (float)(int)in_XMM4_Qa;
  c_02[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_68 = uVar1;
  afVar4 = glmm_fmadd(a_00,b_01,c_02);
  local_2c8 = afVar4._0_8_;
  local_1b8 = local_240 + 4;
  local_268 = *local_1b8;
  uStack_260 = local_240[5];
  local_78 = local_278;
  uStack_70 = uStack_270;
  uVar1 = uStack_70;
  uStack_70._0_4_ = (undefined4)uStack_270;
  local_108 = (undefined4)uStack_70;
  uStack_104 = (undefined4)uStack_70;
  uStack_100 = (undefined4)uStack_70;
  uStack_fc = (undefined4)uStack_70;
  a_01[1] = (float)(undefined4)uStack_70;
  a_01[0] = (float)(undefined4)uStack_70;
  a_01[2] = (float)(int)local_268;
  a_01[3] = (float)(int)((ulong)local_268 >> 0x20);
  b_02[2] = (float)(int)in_XMM3_Qa;
  b_02[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_02[0] = (float)(undefined4)local_2a8;
  b_02[1] = (float)local_2a8._4_4_;
  c_03[2] = (float)(int)in_XMM5_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_03[0] = (float)(int)in_XMM4_Qa;
  c_03[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_70 = uVar1;
  afVar4 = glmm_fmadd(a_01,b_02,c_03);
  local_2a8 = afVar4._0_8_;
  local_88 = local_288;
  uStack_80 = uStack_280;
  uVar1 = uStack_80;
  uStack_80._0_4_ = (undefined4)uStack_280;
  local_118 = (undefined4)uStack_80;
  uStack_114 = (undefined4)uStack_80;
  uStack_110 = (undefined4)uStack_80;
  uStack_10c = (undefined4)uStack_80;
  a_02[1] = (float)(undefined4)uStack_80;
  a_02[0] = (float)(undefined4)uStack_80;
  a_02[2] = (float)(undefined4)local_268;
  a_02[3] = (float)local_268._4_4_;
  b_03[2] = (float)(int)in_XMM3_Qa;
  b_03[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_03[0] = (float)(undefined4)local_2b8;
  b_03[1] = (float)local_2b8._4_4_;
  c_04[2] = (float)(int)in_XMM5_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_04[0] = (float)(int)in_XMM4_Qa;
  c_04[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2a0 = extraout_XMM0_Qb;
  uStack_80 = uVar1;
  afVar4 = glmm_fmadd(a_02,b_03,c_04);
  local_2b8 = afVar4._0_8_;
  local_98 = local_298;
  uStack_90 = uStack_290;
  uVar1 = uStack_90;
  uStack_90._0_4_ = (undefined4)uStack_290;
  local_128 = (undefined4)uStack_90;
  uStack_124 = (undefined4)uStack_90;
  uStack_120 = (undefined4)uStack_90;
  uStack_11c = (undefined4)uStack_90;
  a_03[1] = (float)(undefined4)uStack_90;
  a_03[0] = (float)(undefined4)uStack_90;
  a_03[2] = (float)(undefined4)local_268;
  a_03[3] = (float)local_268._4_4_;
  b_04[2] = (float)(int)in_XMM3_Qa;
  b_04[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_04[0] = (float)(undefined4)local_2c8;
  b_04[1] = (float)local_2c8._4_4_;
  c_05[2] = (float)(int)in_XMM5_Qa;
  c_05[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_05[0] = (float)(int)in_XMM4_Qa;
  c_05[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2b0 = extraout_XMM0_Qb_00;
  uStack_90 = uVar1;
  afVar4 = glmm_fmadd(a_03,b_04,c_05);
  *local_250 = local_2a8;
  local_250[1] = uStack_2a0;
  local_250[2] = local_2b8;
  local_250[3] = uStack_2b0;
  local_250[4] = afVar4._0_8_;
  local_250[5] = extraout_XMM0_Qb_01;
  uVar1 = local_240[7];
  local_250[6] = local_240[6];
  local_250[7] = uVar1;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_z(mat4 m, float rad, mat4 dest) {
  glm_rotate_z(m, rad, dest);
}